

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O1

void reportError(string *message,Node *node)

{
  ostream *poVar1;
  runtime_error *this;
  Mark mark;
  stringstream ss;
  string local_1d0;
  Mark local_1b0;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  local_1b0 = node->mark_;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"ERROR (",7);
  Mark::to_string_abi_cxx11_(&local_1d0,&local_1b0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"): ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(message->_M_dataplus)._M_p,message->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)&local_1d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]]
void reportError(const std::string& message, const Node& node)
{
  const auto mark = node.getMark();
  std::stringstream ss;
  ss << "ERROR (" << mark.to_string() << "): " << message;
  throw std::runtime_error(ss.str());
}